

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O1

void __thiscall mp::pre::LinkRangeList::Add(LinkRangeList *this,LinkRange br)

{
  iterator *piVar1;
  _Elt_pointer pLVar2;
  _Elt_pointer pLVar3;
  LinkRange local_10;
  
  local_10.ir_ = br.ir_;
  local_10.b_ = br.b_;
  pLVar2 = (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar2 != (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
                super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    pLVar3 = pLVar2;
    if (pLVar2 == (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
                  super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_first) {
      pLVar3 = (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
               super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if ((pLVar3[-1].b_ == local_10.b_) && (pLVar3[-1].ir_.end_ == br.ir_.beg_)) {
      pLVar3[-1].ir_.end_ = br.ir_.end_;
      return;
    }
  }
  if (pLVar2 == (this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
                super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<mp::pre::LinkRange,std::allocator<mp::pre::LinkRange>>::
    _M_push_back_aux<mp::pre::LinkRange_const&>
              ((deque<mp::pre::LinkRange,std::allocator<mp::pre::LinkRange>> *)this,&local_10);
  }
  else {
    pLVar2->b_ = local_10.b_;
    pLVar2->ir_ = local_10.ir_;
    piVar1 = &(this->super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>).
              super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void Add(LinkRange br) {
    if (empty() || !back().TryExtendBy(br))
      push_back(br);
  }